

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceField.cpp
# Opt level: O0

RealType __thiscall OpenMD::ForceField::getRcutFromAtomType(ForceField *this,AtomType *at)

{
  bool bVar1;
  EAMType EVar2;
  double *pdVar3;
  AtomType *in_RSI;
  RealType RVar4;
  double dVar5;
  StickyAdapter sa;
  GayBerneAdapter gba;
  SuttonChenAdapter sca;
  EAMAdapter ea;
  LennardJonesAdapter lja;
  RealType rcut;
  LennardJonesAdapter *in_stack_ffffffffffffff80;
  RealType local_78;
  StickyAdapter in_stack_ffffffffffffff90;
  RealType local_68;
  EAMAdapter *in_stack_ffffffffffffffa0;
  double local_58;
  GayBerneAdapter local_50;
  double local_48;
  SuttonChenAdapter local_40;
  double local_38;
  RealType local_30;
  EAMAdapter local_28;
  LennardJonesAdapter local_20;
  double local_18;
  
  local_18 = 0.0;
  LennardJonesAdapter::LennardJonesAdapter(&local_20,in_RSI);
  bVar1 = LennardJonesAdapter::isLennardJones((LennardJonesAdapter *)0x1b31bf);
  if (bVar1) {
    RVar4 = LennardJonesAdapter::getSigma(in_stack_ffffffffffffff80);
    local_18 = RVar4 * 2.5;
  }
  EAMAdapter::EAMAdapter(&local_28,in_RSI);
  bVar1 = EAMAdapter::isEAM((EAMAdapter *)0x1b3203);
  if (bVar1) {
    EVar2 = EAMAdapter::getEAMType(in_stack_ffffffffffffffa0);
    if (EVar2 == eamFuncfl) {
      local_30 = EAMAdapter::getRcut((EAMAdapter *)in_RSI);
      pdVar3 = std::max<double>(&local_18,&local_30);
      local_18 = *pdVar3;
    }
    else if (EVar2 - eamZhou2001 < 2) {
      RVar4 = EAMAdapter::getLatticeConstant(in_stack_ffffffffffffffa0);
      dVar5 = sqrt(10.0);
      local_38 = (RVar4 * dVar5) / 2.0;
      pdVar3 = std::max<double>(&local_18,&local_38);
      local_18 = *pdVar3;
    }
  }
  SuttonChenAdapter::SuttonChenAdapter(&local_40,in_RSI);
  bVar1 = SuttonChenAdapter::isSuttonChen((SuttonChenAdapter *)0x1b32e0);
  if (bVar1) {
    RVar4 = SuttonChenAdapter::getAlpha((SuttonChenAdapter *)in_stack_ffffffffffffff90.at_);
    local_48 = RVar4 * 2.0;
    pdVar3 = std::max<double>(&local_18,&local_48);
    local_18 = *pdVar3;
  }
  GayBerneAdapter::GayBerneAdapter(&local_50,in_RSI);
  bVar1 = GayBerneAdapter::isGayBerne((GayBerneAdapter *)0x1b3340);
  if (bVar1) {
    dVar5 = sqrt(2.0);
    in_stack_ffffffffffffffa0 =
         (EAMAdapter *)GayBerneAdapter::getD((GayBerneAdapter *)in_stack_ffffffffffffff90.at_);
    local_68 = GayBerneAdapter::getL((GayBerneAdapter *)in_stack_ffffffffffffff90.at_);
    pdVar3 = std::max<double>((double *)&stack0xffffffffffffffa0,&local_68);
    local_58 = dVar5 * 2.5 * *pdVar3;
    pdVar3 = std::max<double>(&local_18,&local_58);
    local_18 = *pdVar3;
  }
  StickyAdapter::StickyAdapter((StickyAdapter *)&stack0xffffffffffffff90,in_RSI);
  bVar1 = StickyAdapter::isSticky((StickyAdapter *)0x1b33e0);
  if (bVar1) {
    local_78 = StickyAdapter::getRu((StickyAdapter *)in_stack_ffffffffffffffa0);
    StickyAdapter::getRup((StickyAdapter *)in_stack_ffffffffffffffa0);
    pdVar3 = std::max<double>(&local_78,(double *)&stack0xffffffffffffff80);
    pdVar3 = std::max<double>(&local_18,pdVar3);
    local_18 = *pdVar3;
  }
  return local_18;
}

Assistant:

RealType ForceField::getRcutFromAtomType(AtomType* at) {
    RealType rcut(0.0);

    LennardJonesAdapter lja = LennardJonesAdapter(at);
    if (lja.isLennardJones()) { rcut = 2.5 * lja.getSigma(); }
    EAMAdapter ea = EAMAdapter(at);
    if (ea.isEAM()) {
      switch (ea.getEAMType()) {
      case eamFuncfl:
        rcut = max(rcut, ea.getRcut());
        break;
      case eamZhou2001:
      case eamZhou2004:
        rcut = max(rcut, ea.getLatticeConstant() * sqrt(10.0) / 2.0);
        break;
      default:
        break;
      }
    }
    SuttonChenAdapter sca = SuttonChenAdapter(at);
    if (sca.isSuttonChen()) { rcut = max(rcut, 2.0 * sca.getAlpha()); }
    GayBerneAdapter gba = GayBerneAdapter(at);
    if (gba.isGayBerne()) {
      rcut = max(rcut, 2.5 * sqrt(2.0) * max(gba.getD(), gba.getL()));
    }
    StickyAdapter sa = StickyAdapter(at);
    if (sa.isSticky()) { rcut = max(rcut, max(sa.getRu(), sa.getRup())); }

    return rcut;
  }